

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *
GetKnownQtVersions(vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>
                   *__return_storage_ptr__,cmGeneratorTarget *target)

{
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *paVar1;
  int iVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c8;
  string *prefix_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  string *prefix;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *__range1;
  cmMakefile *makefile;
  anon_class_8_1_6971b95b addVersion;
  allocator<char> local_21;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *local_20;
  cmGeneratorTarget *local_18;
  cmGeneratorTarget *target_local;
  vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_> *result;
  
  local_18 = target;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  if ((GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_
                                 ), iVar2 != 0)) {
    addVersion.result._1_1_ = 1;
    local_20 = &GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_,
               "Qt6Core",&local_21);
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)0x973ff0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_._M_elems + 1),
               "Qt5Core",(allocator<char> *)((long)&addVersion.result + 3));
    local_20 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                *)0x974010;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               (GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_._M_elems + 2),"QT"
               ,(allocator<char> *)((long)&addVersion.result + 2));
    addVersion.result._1_1_ = 0;
    std::allocator<char>::~allocator((allocator<char> *)((long)&addVersion.result + 2));
    std::allocator<char>::~allocator((allocator<char> *)((long)&addVersion.result + 3));
    std::allocator<char>::~allocator(&local_21);
    __cxa_atexit(std::
                 array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                 ::~array,&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  }
  addVersion.result._0_1_ = 0;
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::vector
            (__return_storage_ptr__);
  sVar3 = std::
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          ::size(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  std::vector<cmQtAutoGen::IntegerVersion,_std::allocator<cmQtAutoGen::IntegerVersion>_>::reserve
            (__return_storage_ptr__,sVar3 * 2);
  makefile = (cmMakefile *)__return_storage_ptr__;
  __range1 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              *)cmTarget::GetMakefile(local_18->Target);
  __begin1 = GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_._M_elems;
  __end1 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::begin(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  prefix = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
           ::end(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  for (; paVar1 = __range1, __end1 != prefix; __end1 = __end1 + 1) {
    local_68 = __end1;
    std::operator+(&local_88,__end1,"_VERSION_MAJOR");
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)paVar1,&local_88);
    paVar1 = __range1;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                   local_68,"_VERSION_MINOR");
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)paVar1,(string *)&__range1_1);
    GetKnownQtVersions::anon_class_8_1_6971b95b::operator()
              ((anon_class_8_1_6971b95b *)&makefile,pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::__cxx11::string::~string((string *)&local_88);
  }
  __begin1_1 = GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_._M_elems;
  __end1_1 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::begin(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  prefix_1 = std::
             array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
             ::end(&GetKnownQtVersions(cmGeneratorTarget_const*)::prefixes_abi_cxx11_);
  for (; paVar1 = __range1, __end1_1 != prefix_1; __end1_1 = __end1_1 + 1) {
    local_c8 = __end1_1;
    std::operator+(&local_e8,__end1_1,"_VERSION_MAJOR");
    pcVar4 = cmMakefile::GetProperty((cmMakefile *)paVar1,&local_e8);
    paVar1 = __range1;
    std::operator+(&local_108,local_c8,"_VERSION_MINOR");
    pcVar5 = cmMakefile::GetProperty((cmMakefile *)paVar1,&local_108);
    GetKnownQtVersions::anon_class_8_1_6971b95b::operator()
              ((anon_class_8_1_6971b95b *)&makefile,pcVar4,pcVar5);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<cmQtAutoGen::IntegerVersion> GetKnownQtVersions(
  cmGeneratorTarget const* target)
{
  // Qt version variable prefixes
  static std::array<std::string, 3> const prefixes{ { "Qt6Core", "Qt5Core",
                                                      "QT" } };

  std::vector<cmQtAutoGen::IntegerVersion> result;
  result.reserve(prefixes.size() * 2);
  // Adds a version to the result (nullptr safe)
  auto addVersion = [&result](const char* major, const char* minor) {
    cmQtAutoGen::IntegerVersion ver(CharPtrToUInt(major),
                                    CharPtrToUInt(minor));
    if (ver.Major != 0) {
      result.emplace_back(ver);
    }
  };
  cmMakefile* makefile = target->Target->GetMakefile();

  // Read versions from variables
  for (const std::string& prefix : prefixes) {
    addVersion(makefile->GetDefinition(prefix + "_VERSION_MAJOR"),
               makefile->GetDefinition(prefix + "_VERSION_MINOR"));
  }

  // Read versions from directory properties
  for (const std::string& prefix : prefixes) {
    addVersion(makefile->GetProperty(prefix + "_VERSION_MAJOR"),
               makefile->GetProperty(prefix + "_VERSION_MINOR"));
  }

  return result;
}